

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
Compiler::processLine
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  pointer pbVar1;
  pointer pcVar2;
  string *identifier;
  int iVar3;
  DataType DVar4;
  Scope *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *line_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  iVar3 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar3 == 0) {
    processConsole(this,line);
    return;
  }
  DVar4 = stringToDataType((line->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  if (((DVar4 != UNKNOWN) ||
      (iVar3 = std::__cxx11::string::compare
                         ((char *)(line->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start), iVar3 == 0)) &&
     ((pbVar1 = (line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
      (ulong)((long)(line->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41 ||
      (*pbVar1[2]._M_dataplus._M_p != '(')))) {
    processVariable(this,line);
    return;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)(line->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    processIF(this,line);
    return;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)(line->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  if ((iVar3 != 0) &&
     (iVar3 = std::__cxx11::string::compare
                        ((char *)(line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start), iVar3 != 0)) {
    iVar3 = std::__cxx11::string::compare
                      ((char *)(line->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      processClassDefinition(this,line);
      return;
    }
    pbVar1 = (line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + pbVar1->_M_string_length);
    iVar3 = VirtualStack::isVariable(&(this->igen).super_VirtualStack,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar3 == -1) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if ((iVar3 == 0) ||
         (pbVar1 = (line->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         (pbVar1->_M_dataplus)._M_p[pbVar1->_M_string_length - 1] == ':')) {
        processGoto(this,line);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar3 == 0) {
          processWhile(this,line);
        }
        else {
          line_00 = "else";
          iVar3 = std::__cxx11::string::compare
                            ((char *)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 == 0) {
            processElse(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)line_00);
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)(line->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
            if (iVar3 == 0) {
              processFor(this,line);
            }
            else {
              identifier = (line->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
              pSVar5 = getPastScope(this,identifier);
              if ((pSVar5 == (Scope *)0x0) &&
                 (((ulong)((long)(line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)identifier) <
                   0x41 || (*identifier[2]._M_dataplus._M_p != '(')))) {
                iVar3 = std::__cxx11::string::compare((char *)identifier);
                if (iVar3 != 0) {
                  __return_storage_ptr__ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
                  std::operator+(&local_50,"\'",
                                 (line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
                  std::operator+(__return_storage_ptr__,&local_50,"\' is undefined");
                  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                              std::__cxx11::string::~string);
                }
                processReturn(this,line);
              }
              else {
                processFunction(this,line,true);
              }
            }
          }
        }
      }
    }
    else {
      processVariable(this,line);
    }
    return;
  }
  processScope(this,line);
  return;
}

Assistant:

void Compiler::processLine(const std::vector<std::string>& line)
{
    //Don't do anything if there's nothing in it
    if(line.empty())
        return;

    //Check to see what the line wants to do
    if(line[0] == "Console")
        processConsole(line);
    else if((stringToDataType(line[0]) != DataType::UNKNOWN || line[0] == "auto") && !(line.size() > 2 && line[2][0] == '('))
        processVariable(line);
    else if(line[0] == "if")
        processIF(line);
    else if((line[0] == "{" || line[0] == "}"))
        processScope(line);
    else if(line[0] == "class")
        processClassDefinition(line);
    else if(igen.isVariable(line.front()) != -1)
        processVariable(line);
    else if(line[0] == "goto" || line[0][line[0].size()-1] == ':')
        processGoto(line);
    else if(line[0] == "while")
        processWhile(line);
    else if(line[0] == "else")
        processElse(line);
    else if(line[0] == "for")
        processFor(line);
    else if(getPastScope(line[0]) != nullptr || (line.size() > 2 && line[2][0] == '('))
        processFunction(line);
    else if(line[0] == "return")
        processReturn(line);
    else //Else unknown
        throw std::string("'" + line[0] + "' is undefined");
}